

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

affine3f * pbrt::math::affine3f::rotate(affine3f *__return_storage_ptr__,vec3f *_u,float r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = _u->z * _u->z + _u->x * _u->x + _u->y * _u->y;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  fVar2 = _u->x * fVar1;
  fVar3 = _u->z * fVar1;
  fVar6 = _u->y;
  fVar4 = sinf(r);
  fVar5 = cosf(r);
  fVar1 = fVar1 * fVar6;
  fVar6 = 1.0 - fVar5;
  (__return_storage_ptr__->l).vx.x = (1.0 - fVar2 * fVar2) * fVar5 + fVar2 * fVar2;
  (__return_storage_ptr__->l).vx.y = fVar4 * fVar3 + fVar6 * fVar2 * fVar1;
  (__return_storage_ptr__->l).vx.z = -(fVar4 * fVar1) + fVar6 * fVar3 * fVar2;
  (__return_storage_ptr__->l).vy.x = -(fVar4 * fVar3) + fVar6 * fVar2 * fVar1;
  (__return_storage_ptr__->l).vy.y = fVar1 * fVar1 + (1.0 - fVar1 * fVar1) * fVar5;
  (__return_storage_ptr__->l).vy.z = fVar3 * fVar1 * fVar6 + fVar2 * fVar4;
  (__return_storage_ptr__->l).vz.x = fVar3 * fVar2 * fVar6 + fVar4 * fVar1;
  (__return_storage_ptr__->l).vz.y = fVar3 * fVar1 * fVar6 + -(fVar2 * fVar4);
  (__return_storage_ptr__->l).vz.z = (1.0 - fVar3 * fVar3) * fVar5 + fVar3 * fVar3;
  (__return_storage_ptr__->p).x = 0.0;
  (__return_storage_ptr__->p).y = 0.0;
  (__return_storage_ptr__->p).z = 0.0;
  return __return_storage_ptr__;
}

Assistant:

inline affine3f affine3f::rotate(const vec3f& _u, float r) {
      vec3f u = normalize(_u);
      float s = sinf(r), c = cosf(r);
      mat3f l = mat3f(vec3f(u.x*u.x+(1-u.x*u.x)*c, u.x*u.y*(1-c)+u.z*s, u.x*u.z*(1-c)-u.y*s),
                      vec3f(u.x*u.y*(1-c)-u.z*s, u.y*u.y+(1-u.y*u.y)*c, u.y*u.z*(1-c)+u.x*s),   
                      vec3f(u.x*u.z*(1-c)+u.y*s, u.y*u.z*(1-c)-u.x*s, u.z*u.z+(1-u.z*u.z)*c));
      return affine3f(l, vec3f(0));
    }